

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O2

void __thiscall bitfoot::Bitfoot::SetHashSize(Bitfoot *this,int64_t mbytes)

{
  bool bVar1;
  Output local_10;
  
  bVar1 = TranspositionTable::Resize((TranspositionTable *)_tt,mbytes);
  if (!bVar1) {
    senjo::Output::Output(&local_10,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"cannot allocate hash table of ");
    std::ostream::_M_insert<long>((long)&std::cout);
    std::operator<<((ostream *)&std::cout," MB");
    senjo::Output::~Output(&local_10);
  }
  return;
}

Assistant:

void SetHashSize(const int64_t mbytes) {
    if (!_tt.Resize(mbytes)) {
      senjo::Output() << "cannot allocate hash table of " << mbytes << " MB";
    }
  }